

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType0::SetDataValues(GridDataType0 *this,KUINT8 *Data,KUINT16 NumBytes)

{
  ushort local_1c;
  KUINT16 i;
  KUINT16 NumBytes_local;
  KUINT8 *Data_local;
  GridDataType0 *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_vui8DataVals);
  *(KUINT16 *)&(this->super_GridData).field_0xc = NumBytes;
  for (local_1c = 0; local_1c < *(ushort *)&(this->super_GridData).field_0xc;
      local_1c = local_1c + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8DataVals,Data + local_1c);
  }
  return;
}

Assistant:

void GridDataType0::SetDataValues( KUINT8 * Data, KUINT16 NumBytes )
{
    m_vui8DataVals.clear();
    m_ui16NumBytes = NumBytes;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        m_vui8DataVals.push_back( Data[i] );
    }
}